

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_api.c
# Opt level: O2

MPP_RET avsd_deinit(void *decoder)

{
  if (decoder == (void *)0x0) {
    if ((avsd_parse_debug & 4) != 0) {
      _mpp_log_l(4,"avsd_api","input empty(%d).\n",(char *)0x0,0x2f);
    }
  }
  else {
    if ((avsd_parse_debug & 8) != 0) {
      _mpp_log_l(4,"avsd_api","In.","avsd_deinit");
    }
    mpp_packet_deinit((MppPacket *)((long)decoder + 0x10));
    if (*(void **)((long)decoder + 0x58) != (void *)0x0) {
      mpp_osal_free("avsd_deinit",*(void **)((long)decoder + 0x58));
    }
    *(undefined8 *)((long)decoder + 0x58) = 0;
    if (*(void **)((long)decoder + 0x50) != (void *)0x0) {
      mpp_osal_free("avsd_deinit",*(void **)((long)decoder + 0x50));
    }
    *(undefined8 *)((long)decoder + 0x50) = 0;
  }
  if ((avsd_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avsd_api","Out.","avsd_deinit");
  }
  return MPP_OK;
}

Assistant:

MPP_RET avsd_deinit(void *decoder)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdCtx_t *p_dec = (AvsdCtx_t *)decoder;

    INP_CHECK(ret, !decoder);
    AVSD_PARSE_TRACE("In.");

    mpp_packet_deinit(&p_dec->task_pkt);
    MPP_FREE(p_dec->streambuf);
    MPP_FREE(p_dec->mem);

__RETURN:
    (void)decoder;
    AVSD_PARSE_TRACE("Out.");
    return ret = MPP_OK;
}